

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_next.c
# Opt level: O1

mpt_node * mpt_node_next(mpt_node *curr,char *ident)

{
  mpt_node **ppmVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  void *__s2;
  mpt_node *unaff_R13;
  mpt_node *pmVar5;
  ulong uVar6;
  
  if (ident == (char *)0x0) {
    uVar6 = 0;
  }
  else {
    sVar4 = strlen(ident);
    uVar6 = sVar4 + 1;
  }
  do {
    pmVar5 = curr;
    if (pmVar5 == (mpt_node *)0x0) {
      return (mpt_node *)0x0;
    }
    __s2 = mpt_identifier_data(&pmVar5->ident);
    if (((uVar6 == (pmVar5->ident)._len) && ((pmVar5->ident)._charset == '\x01')) &&
       ((uVar6 == 0 || (iVar3 = bcmp(ident,__s2,uVar6 - 1), iVar3 == 0)))) {
      bVar2 = false;
      curr = pmVar5;
    }
    else {
      ppmVar1 = &pmVar5->next;
      bVar2 = true;
      pmVar5 = unaff_R13;
      curr = *ppmVar1;
    }
    unaff_R13 = pmVar5;
  } while (bVar2);
  return pmVar5;
}

Assistant:

extern MPT_STRUCT(node) *mpt_node_next(const MPT_STRUCT(node) *curr, const char *ident)
{
	size_t idlen;
	
	idlen = ident ? strlen(ident) + 1 : 0;
	
	while (curr) {
		const void *cid;
		size_t clen;
		
		cid  = mpt_identifier_data(&curr->ident);
		clen = curr->ident._len;
		if (idlen == clen
		    && curr->ident._charset == MPT_CHARSET(UTF8)
		    && (!idlen || !memcmp(ident, cid, idlen - 1))) {
			return (MPT_STRUCT(node) *) curr;
		}
		curr = curr->next;
	}
	return 0;
}